

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O3

int ly_clean_plugins(void)

{
  char **__ptr;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  pthread_mutex_lock((pthread_mutex_t *)&plugins_lock);
  plugin_refs = plugin_refs - 1;
  iVar1 = 1;
  if ((plugin_refs == 0) && (iVar1 = 0, type_plugins_count != 0 || ext_plugins_count != 0)) {
    free(ext_plugins);
    ext_plugins = (lyext_plugin_list *)0x0;
    ext_plugins_count = 0;
    free(type_plugins);
    __ptr = loaded_plugins;
    type_plugins = (lytype_plugin_list *)0x0;
    type_plugins_count = 0;
    uVar2 = (ulong)loaded_plugins_count;
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        free(__ptr[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    free(__ptr);
    loaded_plugins = (char **)0x0;
    loaded_plugins_count = 0;
    if (dlhandlers.number != 0) {
      uVar2 = 0;
      do {
        dlclose(dlhandlers.set.s[uVar2]);
        uVar2 = uVar2 + 1;
      } while (uVar2 < dlhandlers.number);
    }
    free(dlhandlers.set.s);
    dlhandlers = (ly_set)ZEXT816(0);
    iVar1 = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&plugins_lock);
  return iVar1;
}

Assistant:

API int
ly_clean_plugins(void)
{
    unsigned int u;
    int ret = EXIT_SUCCESS;

#ifdef STATIC
    /* lock the extension plugins list */
    pthread_mutex_lock(&plugins_lock);

    if(ext_plugins) {
        free(ext_plugins);
        ext_plugins = NULL;
        ext_plugins_count = 0;
    }

    if(type_plugins) {
        free(type_plugins);
        type_plugins = NULL;
        type_plugins_count = 0;
    }

    for (u = 0; u < loaded_plugins_count; ++u) {
        free(loaded_plugins[u]);
    }
    free(loaded_plugins);
    loaded_plugins = NULL;
    loaded_plugins_count = 0;

    /* unlock the global structures */
    pthread_mutex_unlock(&plugins_lock);
    return ret;
#endif /* STATIC */

    /* lock the extension plugins list */
    pthread_mutex_lock(&plugins_lock);

    if (--plugin_refs) {
        /* there is a context that may refer to the plugins, so we cannot remove them */
        ret = EXIT_FAILURE;
        goto cleanup;
    }

    if (!ext_plugins_count && !type_plugins_count) {
        /* no plugin loaded - nothing to do */
        goto cleanup;
    }

    /* clean the lists */
    free(ext_plugins);
    ext_plugins = NULL;
    ext_plugins_count = 0;

    free(type_plugins);
    type_plugins = NULL;
    type_plugins_count = 0;

    for (u = 0; u < loaded_plugins_count; ++u) {
        free(loaded_plugins[u]);
    }
    free(loaded_plugins);
    loaded_plugins = NULL;
    loaded_plugins_count = 0;

    /* close the dl handlers */
    for (u = 0; u < dlhandlers.number; u++) {
        dlclose(dlhandlers.set.g[u]);
    }
    free(dlhandlers.set.g);
    dlhandlers.set.g = NULL;
    dlhandlers.size = 0;
    dlhandlers.number = 0;

cleanup:
    /* unlock the global structures */
    pthread_mutex_unlock(&plugins_lock);

    return ret;
}